

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.c
# Opt level: O1

int uv_timer_stop(uv_timer_t *handle)

{
  uint *puVar1;
  anon_struct_16_2_d918446b_for_timer_heap *heap;
  uint uVar2;
  uv_loop_t *puVar3;
  heap_node *child;
  heap_node *phVar4;
  long *plVar5;
  bool bVar6;
  heap_node *phVar7;
  heap_node *child_00;
  int iVar8;
  uint uVar9;
  uint uVar10;
  anon_struct_16_2_d918446b_for_timer_heap *paVar11;
  
  if ((handle->flags & 4) == 0) {
    ((handle->node).queue.prev)->next = (uv__queue *)(handle->node).heap[0];
    ((handle->node).queue.next)->prev = (uv__queue *)(handle->node).heap[1];
  }
  else {
    puVar3 = handle->loop;
    uVar2 = (puVar3->timer_heap).nelts;
    if (uVar2 != 0) {
      uVar9 = 0;
      iVar8 = 0;
      if (uVar2 != 1) {
        iVar8 = 0;
        uVar9 = 0;
        uVar10 = uVar2;
        do {
          uVar9 = (uVar10 & 1) + uVar9 * 2;
          iVar8 = iVar8 + 1;
          bVar6 = 3 < uVar10;
          uVar10 = uVar10 >> 1;
        } while (bVar6);
      }
      heap = &puVar3->timer_heap;
      paVar11 = heap;
      for (; iVar8 != 0; iVar8 = iVar8 + -1) {
        paVar11 = (anon_struct_16_2_d918446b_for_timer_heap *)
                  ((ulong)(uVar9 * 8 & 8) + (long)paVar11->min);
        uVar9 = uVar9 >> 1;
      }
      (puVar3->timer_heap).nelts = uVar2 - 1;
      child = (heap_node *)paVar11->min;
      paVar11->min = (void *)0x0;
      if (child == (heap_node *)&handle->node) {
        if (child == (heap_node *)heap->min) {
          heap->min = (void *)0x0;
        }
      }
      else {
        phVar4 = (heap_node *)(handle->node).heap[0];
        child->left = phVar4;
        child->right = (heap_node *)(handle->node).heap[1];
        child->parent = (heap_node *)(handle->node).heap[2];
        if (phVar4 != (heap_node *)0x0) {
          phVar4->parent = child;
        }
        if (child->right != (heap_node *)0x0) {
          child->right->parent = child;
        }
        plVar5 = (long *)(handle->node).heap[2];
        paVar11 = heap;
        if (plVar5 != (long *)0x0) {
          paVar11 = (anon_struct_16_2_d918446b_for_timer_heap *)
                    (plVar5 + ((anon_union_24_2_508bea68_for_node *)*plVar5 != &handle->node));
        }
        paVar11->min = child;
        while( true ) {
          phVar4 = child->left;
          phVar7 = child;
          if (phVar4 != (heap_node *)0x0) {
            phVar7 = phVar4;
            if (((child[1].left <= phVar4[1].left) &&
                (phVar7 = child, phVar4[1].left <= child[1].left)) &&
               (phVar7 = phVar4, child[1].parent <= phVar4[1].parent)) {
              phVar7 = child;
            }
          }
          phVar4 = child->right;
          child_00 = phVar7;
          if (phVar4 != (heap_node *)0x0) {
            child_00 = phVar4;
            if (((phVar7[1].left <= phVar4[1].left) &&
                (child_00 = phVar7, phVar4[1].left <= phVar7[1].left)) &&
               (child_00 = phVar4, phVar7[1].parent <= phVar4[1].parent)) {
              child_00 = phVar7;
            }
          }
          if (child_00 == child) break;
          heap_node_swap((heap *)heap,child,child_00);
        }
        while (phVar4 = child->parent, phVar4 != (heap_node *)0x0) {
          if ((phVar4[1].left <= child[1].left) &&
             ((phVar4[1].left < child[1].left || (phVar4[1].parent <= child[1].parent)))) break;
          heap_node_swap((heap *)heap,phVar4,child);
        }
      }
    }
    uVar2 = handle->flags;
    if (((uVar2 & 4) != 0) && (handle->flags = uVar2 & 0xfffffffb, (uVar2 & 8) != 0)) {
      puVar1 = &handle->loop->active_handles;
      *puVar1 = *puVar1 - 1;
    }
  }
  (handle->node).heap[0] = &handle->node;
  (handle->node).heap[1] = &handle->node;
  return 0;
}

Assistant:

int uv_timer_stop(uv_timer_t* handle) {
  if (uv__is_active(handle)) {
    heap_remove((struct heap*) &handle->loop->timer_heap,
                (struct heap_node*) &handle->node.heap,
                timer_less_than);
    uv__handle_stop(handle);
  } else {
    uv__queue_remove(&handle->node.queue);
  }

  uv__queue_init(&handle->node.queue);
  return 0;
}